

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushStyleColor(ImGuiCol idx,ImU32 col)

{
  ImVec4 *pIVar1;
  ImGuiColMod *pIVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImGuiContext *pIVar7;
  int iVar8;
  ImGuiColMod *__dest;
  int iVar9;
  int iVar10;
  ImVec4 *pIVar11;
  
  pIVar7 = GImGui;
  pIVar11 = (GImGui->Style).Colors + idx;
  fVar3 = pIVar11->x;
  fVar4 = pIVar11->y;
  pIVar1 = (GImGui->Style).Colors + idx;
  fVar5 = pIVar1->z;
  fVar6 = pIVar1->w;
  iVar8 = (GImGui->ColorModifiers).Size;
  if (iVar8 == (GImGui->ColorModifiers).Capacity) {
    if (iVar8 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar8 / 2 + iVar8;
    }
    iVar10 = iVar8 + 1;
    if (iVar8 + 1 < iVar9) {
      iVar10 = iVar9;
    }
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    __dest = (ImGuiColMod *)(*GImAllocatorAllocFunc)((long)iVar10 * 0x14,GImAllocatorUserData);
    pIVar2 = (pIVar7->ColorModifiers).Data;
    if (pIVar2 != (ImGuiColMod *)0x0) {
      memcpy(__dest,pIVar2,(long)(pIVar7->ColorModifiers).Size * 0x14);
      pIVar2 = (pIVar7->ColorModifiers).Data;
      if (pIVar2 != (ImGuiColMod *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    }
    (pIVar7->ColorModifiers).Data = __dest;
    (pIVar7->ColorModifiers).Capacity = iVar10;
    iVar8 = (pIVar7->ColorModifiers).Size;
  }
  else {
    __dest = (GImGui->ColorModifiers).Data;
  }
  __dest[iVar8].Col = idx;
  pIVar1 = &__dest[iVar8].BackupValue;
  pIVar1->x = fVar3;
  pIVar1->y = fVar4;
  pIVar1->z = fVar5;
  pIVar1->w = fVar6;
  (pIVar7->ColorModifiers).Size = (pIVar7->ColorModifiers).Size + 1;
  pIVar11->x = (float)(col & 0xff) * 0.003921569;
  (pIVar7->Style).Colors[idx].y = (float)(col >> 8 & 0xff) * 0.003921569;
  (pIVar7->Style).Colors[idx].z = (float)(col >> 0x10 & 0xff) * 0.003921569;
  (pIVar7->Style).Colors[idx].w = (float)(col >> 0x18) * 0.003921569;
  return;
}

Assistant:

void ImGui::PushStyleColor(ImGuiCol idx, ImU32 col)
{
    ImGuiContext& g = *GImGui;
    ImGuiColMod backup;
    backup.Col = idx;
    backup.BackupValue = g.Style.Colors[idx];
    g.ColorModifiers.push_back(backup);
    g.Style.Colors[idx] = ColorConvertU32ToFloat4(col);
}